

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

ON_Interval __thiscall ON_PolyCurve::SegmentDomain(ON_PolyCurve *this,int segment_index)

{
  int iVar1;
  double *pdVar2;
  ON_Interval OVar3;
  int segment_index_local;
  ON_PolyCurve *this_local;
  ON_Interval domain;
  
  ON_Interval::ON_Interval((ON_Interval *)&this_local);
  if (-1 < segment_index) {
    iVar1 = Count(this);
    if (segment_index < iVar1) {
      pdVar2 = ON_SimpleArray<double>::operator[](&this->m_t,segment_index);
      this_local = (ON_PolyCurve *)*pdVar2;
      pdVar2 = ON_SimpleArray<double>::operator[](&this->m_t,segment_index + 1);
      domain.m_t[0] = *pdVar2;
    }
  }
  OVar3.m_t[0] = (double)this_local;
  OVar3.m_t[1] = domain.m_t[0];
  return (ON_Interval)OVar3.m_t;
}

Assistant:

ON_Interval 
ON_PolyCurve::SegmentDomain( int segment_index ) const
{
  ON_Interval domain;
  if ( segment_index >= 0 && segment_index < Count() ) {
    domain.m_t[0] = m_t[segment_index];
    domain.m_t[1] = m_t[segment_index+1];
  }
  return domain;
}